

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_Claus(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
             int nCutsMax,int nBatches,int fStepUp,int fBmc,int fRefs,int fTarget,int fVerbose,
             int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Clu_Man_t *p;
  Cnf_Dat_t *p_00;
  sat_solver *psVar6;
  abctime aVar7;
  abctime aVar8;
  char *pcVar9;
  uint uVar10;
  
  aVar5 = Abc_Clock();
  p = Fra_ClausAlloc(pAig,nFrames,nPref,nClausesMax,nLutSize,nLevels,nCutsMax,nBatches,fStepUp,
                     fTarget,fVerbose,fVeryVerbose);
  if (p->fVerbose != 0) {
    printf("PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n",nFrames,
           (ulong)(uint)nPref,(ulong)(uint)nClausesMax,(ulong)(uint)nLutSize);
    pcVar9 = "yes";
    if (fStepUp == 0) {
      pcVar9 = "no";
    }
    printf("Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n",
           (ulong)(uint)nLevels,(ulong)(uint)nCutsMax,(ulong)(uint)nBatches,pcVar9);
  }
  iVar3 = p->fTarget;
  if ((iVar3 != 0) && (pAig->nObjs[3] - pAig->nRegs != 1)) {
    __assert_fail("!p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                  ,0x6a2,
                  "int Fra_Claus(Aig_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int, int)"
                 );
  }
  Abc_Clock();
  p_00 = Cnf_DeriveSimple(p->pAig,p->pAig->nObjs[3]);
  p->pCnf = p_00;
  Abc_Clock();
  iVar4 = p->nFrames;
  uVar10 = p->nPref + iVar4;
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,uVar10,1);
  p->pSatBmc = psVar6;
  if (psVar6 == (sat_solver *)0x0) {
    pcVar9 = "Error: BMC solver is unsat.";
  }
  else {
    if ((iVar3 != 0) && (iVar2 = Fra_ClausRunBmc(p), iVar2 == 0)) {
      printf("Problem fails the base case after %d frame expansion.\n",(ulong)uVar10);
      goto LAB_0052d8b0;
    }
    Abc_Clock();
    psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,iVar4 + 1,0);
    p->pSatMain = psVar6;
    if (psVar6 != (sat_solver *)0x0) {
      uVar10 = 0;
      do {
        while( true ) {
          if (p->nBatches <= (int)uVar10) goto LAB_0052d8ce;
          uVar1 = uVar10 + 1;
          printf("*** BATCH %d:  ",(ulong)uVar1);
          if ((p->nLutSize < 0xc && uVar10 != 0) &&
             (((p->fFiltering == 0 || (p->fNothingNew != 0)) || (p->fStepUp != 0)))) {
            p->nLutSize = p->nLutSize + 1;
          }
          printf("Using %d-cuts.\n");
          if ((iVar3 != 0) && (iVar3 = Fra_ClausRunSat(p), iVar3 != 0)) {
            pcVar9 = "Problem is inductive without strengthening.";
            goto LAB_0052d8ab;
          }
          Abc_Clock();
          iVar3 = p->nPref;
          p->nPref = 0;
          p->nSimWordsPref = 0;
          Fra_ClausProcessClauses2(p,fRefs);
          p->nPref = iVar3;
          p->nSimWordsPref = (p->nSimWords * iVar3) / p->nSimFrames;
          if (fBmc != 0) {
            aVar7 = Abc_Clock();
            uVar10 = Fra_ClausBmcClauses(p);
            p->nClauses = p->nClauses - uVar10;
            if (fVerbose != 0) {
              iVar3 = 0x8106c7;
              printf("BMC disproved %d clauses.  ",(ulong)uVar10);
              Abc_Print(iVar3,"%s =","Time");
              aVar8 = Abc_Clock();
              Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar8 - aVar7) / 1000000.0);
            }
          }
          uVar10 = 0;
          aVar7 = Abc_Clock();
          iVar4 = 1;
          while (0 < iVar4) {
            if (fVerbose != 0) {
              printf("Iter %3d : Begin = %5d. ",(ulong)uVar10,(ulong)(uint)p->nClauses);
            }
            iVar4 = Fra_ClausInductiveClauses(p);
            if (0 < iVar4) {
              p->nClauses = p->nClauses - iVar4;
            }
            if (fVerbose != 0) {
              iVar3 = 0x8106fc;
              printf("End = %5d. Exs = %5d.  ",(ulong)(uint)p->nClauses,(ulong)(uint)p->nCexes);
              Abc_Print(iVar3,"%s =","Time");
              aVar8 = Abc_Clock();
              Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar8 - aVar7) / 1000000.0);
            }
            aVar7 = Abc_Clock();
            uVar10 = uVar10 + 1;
          }
          Fra_ClausAddToStorage(p);
          iVar3 = p->fTarget;
          uVar10 = uVar1;
          if (iVar3 != 0) break;
          iVar4 = 0x810790;
          printf("Finished proving inductive clauses. ");
          Abc_Print(iVar4,"%s =","Time  ");
          aVar7 = Abc_Clock();
          Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
        }
        pcVar9 = "Fra_Claus(): Internal error.  ";
        if ((iVar4 != -1) && (pcVar9 = "Property FAILS during refinement.  ", p->fFail == 0)) {
          pcVar9 = "Property HOLDS inductively after strengthening.  ";
        }
        printf(pcVar9);
        iVar4 = (int)pcVar9;
        Abc_Print(iVar4,"%s =","Time  ");
        aVar7 = Abc_Clock();
        Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
      } while (p->fFail != 0);
      iVar3 = 1;
LAB_0052d8ce:
      Fra_InvariantVerify(pAig,nFrames,p->vClausesProven,p->vLitsProven);
      if (p->fVerbose != 0) {
        Fra_ClausPrintIndClauses(p);
        Fra_ClausEstimateCoverage(p);
      }
      if (iVar3 == 0) {
        Fra_ClausWriteIndClauses(p);
      }
      goto LAB_0052d8b0;
    }
    pcVar9 = "Error: Main solver is unsat.";
  }
LAB_0052d8ab:
  puts(pcVar9);
LAB_0052d8b0:
  Fra_ClausFree(p);
  return 1;
}

Assistant:

int Fra_Claus( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRefs, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    abctime clk, clkTotal = Abc_Clock(), clkInd;
    int b, Iter, Counter, nPrefOld;
    int nClausesBeg = 0;

    // create the manager
    p = Fra_ClausAlloc( pAig, nFrames, nPref, nClausesMax, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fTarget, fVerbose, fVeryVerbose );
if ( p->fVerbose )
{
    printf( "PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n", nFrames, nPref, nClausesMax, nLutSize );
    printf( "Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n", nLevels, nCutsMax, nBatches, fStepUp? "yes":"no" );
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    assert( !p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1 );

clk = Abc_Clock();
    // derive CNF
//    if ( p->fTarget )
//        p->pAig->nRegs++;
    p->pCnf = Cnf_DeriveSimple( p->pAig, Aig_ManCoNum(p->pAig) );
//    if ( p->fTarget )
//        p->pAig->nRegs--;
if ( fVerbose )
{
//ABC_PRT( "CNF    ", Abc_Clock() - clk );
}

    // check BMC
clk = Abc_Clock();
    p->pSatBmc = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nPref + p->nFrames, 1 );
    if ( p->pSatBmc == NULL )
    {
        printf( "Error: BMC solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 
    if ( p->fTarget && !Fra_ClausRunBmc( p ) )
    {
        printf( "Problem fails the base case after %d frame expansion.\n", p->nPref + p->nFrames );
        Fra_ClausFree( p );
        return 1;
    }
if ( fVerbose )
{
//ABC_PRT( "SAT-bmc", Abc_Clock() - clk );
}

    // start the SAT solver
clk = Abc_Clock();
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 


    for ( b = 0; b < p->nBatches; b++ )
    {
//        if ( fVerbose )
        printf( "*** BATCH %d:  ", b+1 );
        if ( b && p->nLutSize < 12 && (!p->fFiltering || p->fNothingNew || p->fStepUp) )
            p->nLutSize++;
        printf( "Using %d-cuts.\n", p->nLutSize );

        // try solving without additional clauses
        if ( p->fTarget && Fra_ClausRunSat( p ) )
        {
            printf( "Problem is inductive without strengthening.\n" );
            Fra_ClausFree( p );
            return 1;
        }
        if ( fVerbose )
        {
//        ABC_PRT( "SAT-ind", Abc_Clock() - clk );
        }
 
        // collect the candidate inductive clauses using 4-cuts
        clk = Abc_Clock();
        nPrefOld = p->nPref; p->nPref = 0; p->nSimWordsPref = 0;
    //    Fra_ClausProcessClauses( p, fRefs );
        Fra_ClausProcessClauses2( p, fRefs );
        p->nPref = nPrefOld;
        p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;
        nClausesBeg = p->nClauses;

    //ABC_PRT( "Clauses", Abc_Clock() - clk );


        // check clauses using BMC
        if ( fBmc ) 
        {
            clk = Abc_Clock();
            Counter = Fra_ClausBmcClauses( p );
            p->nClauses -= Counter;
            if ( fVerbose )
            {
                printf( "BMC disproved %d clauses.  ", Counter );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
        }


        // prove clauses inductively
        clkInd = clk = Abc_Clock();
        Counter = 1;
        for ( Iter = 0; Counter > 0; Iter++ )
        {
            if ( fVerbose )
            printf( "Iter %3d : Begin = %5d. ", Iter, p->nClauses );
            Counter = Fra_ClausInductiveClauses( p );
            if ( Counter > 0 )
               p->nClauses -= Counter;
            if ( fVerbose )
            {
            printf( "End = %5d. Exs = %5d.  ", p->nClauses, p->nCexes );
    //        printf( "\n" );
            ABC_PRT( "Time", Abc_Clock() - clk );
            }
            clk = Abc_Clock();
        }
        // add proved clauses to storage
        Fra_ClausAddToStorage( p );
        // report the results
        if ( p->fTarget )
        {
            if ( Counter == -1 )
                printf( "Fra_Claus(): Internal error.  " );
            else if ( p->fFail )
                printf( "Property FAILS during refinement.  " );
            else
                printf( "Property HOLDS inductively after strengthening.  " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
            if ( !p->fFail )
                break;
        }
        else
        {
            printf( "Finished proving inductive clauses. " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
        }
    }

    // verify the computed interpolant
    Fra_InvariantVerify( pAig, nFrames, p->vClausesProven, p->vLitsProven );
//    printf( "THIS COMMAND IS KNOWN TO HAVE A BUG!\n" );

//    if ( !p->fTarget && p->fVerbose )
    if ( p->fVerbose )
    {
        Fra_ClausPrintIndClauses( p );
        Fra_ClausEstimateCoverage( p );
    }

    if ( !p->fTarget )
    {
        Fra_ClausWriteIndClauses( p );
    }
/*
    // print the statistic into a file
    {
        FILE * pTable;
        assert( p->nBatches == 1 );
        pTable = fopen( "stats.txt", "a+" );
        fprintf( pTable, "%s ",  pAig->pName );
        fprintf( pTable, "%d ",  Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManNodeNum(pAig) );
        fprintf( pTable, "%d ",  p->nCuts );
        fprintf( pTable, "%d ",  nClausesBeg );
        fprintf( pTable, "%d ",  p->nClauses );
        fprintf( pTable, "%d ",  Iter );
        fprintf( pTable, "%.2f ", (float)(clkInd-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkInd)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
*/
    // clean the manager
    Fra_ClausFree( p );
    return 1;
}